

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O2

void __thiscall HighsNodeQueue::setNumCol(HighsNodeQueue *this,HighsInt numCol)

{
  _Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false> _Var1;
  pointer __p;
  pointer __p_00;
  pointer psVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  __uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
  local_30;
  
  if (this->numCol != numCol) {
    this->numCol = numCol;
    __p_00 = (pointer)operator_new(0x20);
    __p_00->freeListHead = (void *)0x0;
    __p_00->currChunkStart = (char *)0x0;
    __p_00->currChunkEnd = (char *)0x0;
    __p_00->chunkListHead = (Chunk *)0x0;
    local_30._M_t.
    super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
    .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl =
         (tuple<HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
          )(_Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
            )0x0;
    std::
    __uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
    ::reset((__uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
             *)this,__p_00);
    std::
    unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
    ::~unique_ptr((unique_ptr<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
                   *)&local_30);
    if (numCol != 0) {
      psVar2 = (pointer)operator_new((long)numCol * 0x38);
      local_30._M_t.
      super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
      .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl =
           (tuple<HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
            )(_Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
              )0x0;
      std::
      __uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::reset((__uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)&this->colLowerNodesPtr,psVar2);
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::~unique_ptr((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     *)&local_30);
      psVar2 = (pointer)operator_new((long)numCol * 0x38);
      local_30._M_t.
      super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
      .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl =
           (tuple<HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
            )(_Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
              )0x0;
      std::
      __uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::reset((__uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               *)&this->colUpperNodesPtr,psVar2);
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::~unique_ptr((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                     *)&local_30);
      _Var1._M_head_impl =
           (this->allocatorState)._M_t.
           super___uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
           ._M_t.
           super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
           .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl;
      uVar3 = 0;
      uVar4 = (ulong)(uint)numCol;
      if (numCol < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 * 0x38 - uVar3 != 0; uVar3 = uVar3 + 0x38) {
        lVar5 = (long)&(((this->colLowerNodesPtr)._M_t.
                         super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                         .
                         super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                        ._M_head_impl)->_M_t)._M_impl + uVar3;
        lVar6 = lVar5 + 0x10;
        *(AllocatorState **)lVar5 = _Var1._M_head_impl;
        *(undefined4 *)lVar6 = 0;
        *(undefined8 *)(lVar5 + 0x18) = 0;
        *(long *)(lVar5 + 0x20) = lVar6;
        *(long *)(lVar5 + 0x28) = lVar6;
        *(undefined8 *)(lVar5 + 0x30) = 0;
        puVar7 = (undefined8 *)
                 ((long)&(((this->colUpperNodesPtr)._M_t.
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                          ._M_head_impl)->_M_t)._M_impl + uVar3);
        puVar8 = puVar7 + 2;
        *puVar7 = _Var1._M_head_impl;
        *(undefined4 *)puVar8 = 0;
        puVar7[3] = 0;
        puVar7[4] = puVar8;
        puVar7[5] = puVar8;
        puVar7[6] = 0;
      }
    }
  }
  return;
}

Assistant:

void HighsNodeQueue::setNumCol(HighsInt numCol) {
  if (this->numCol == numCol) return;
  this->numCol = numCol;
  allocatorState = std::unique_ptr<AllocatorState>(new AllocatorState());

  if (numCol == 0) return;
  colLowerNodesPtr =
      NodeSetArray((NodeSet*)::operator new(sizeof(NodeSet) * numCol));
  colUpperNodesPtr =
      NodeSetArray((NodeSet*)::operator new(sizeof(NodeSet) * numCol));

  NodesetAllocator<std::pair<double, int64_t>> allocator(allocatorState.get());
  for (HighsInt i = 0; i < numCol; ++i) {
    new (colLowerNodesPtr.get() + i) NodeSet(allocator);
    new (colUpperNodesPtr.get() + i) NodeSet(allocator);
  }
}